

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

void __thiscall
spvtools::opt::SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes
          (SENodeSimplifyImpl *this,SENode *new_node,SENode *child,bool negation)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int64_t iVar3;
  long lVar4;
  pointer ppVar5;
  reference ppSVar6;
  SENode *pSVar7;
  SENode *negated_node;
  SENode *next_child;
  iterator __end6;
  iterator __begin6;
  SENode *__range6;
  pair<spvtools::opt::SENode_*const,_long> local_48;
  _Self local_38;
  _Self local_30;
  iterator iterator;
  int32_t sign;
  bool negation_local;
  SENode *child_local;
  SENode *new_node_local;
  SENodeSimplifyImpl *this_local;
  
  iterator._M_node._0_4_ = 1;
  if (negation) {
    iterator._M_node._0_4_ = -1;
  }
  iterator._M_node._7_1_ = negation;
  _sign = child;
  child_local = new_node;
  new_node_local = (SENode *)this;
  iVar2 = (**child->_vptr_SENode)();
  if (iVar2 == 0) {
    iVar2 = (*_sign->_vptr_SENode[4])();
    iVar3 = SEConstantNode::FoldToSingleValue((SEConstantNode *)CONCAT44(extraout_var,iVar2));
    this->constant_accumulator_ = iVar3 * (int)iterator._M_node + this->constant_accumulator_;
  }
  else {
    iVar2 = (**_sign->_vptr_SENode)();
    if ((iVar2 == 5) || (iVar2 = (**_sign->_vptr_SENode)(), iVar2 == 1)) {
      local_30._M_node =
           (_Base_ptr)
           std::
           map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
           ::find(&this->accumulators_,(key_type *)&sign);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
           ::end(&this->accumulators_);
      bVar1 = std::operator==(&local_30,&local_38);
      if (bVar1) {
        std::pair<spvtools::opt::SENode_*const,_long>::pair<spvtools::opt::SENode_*&,_int_&,_true>
                  (&local_48,(SENode **)&sign,(int *)&iterator);
        std::
        map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
        ::insert(&this->accumulators_,&local_48);
      }
      else {
        lVar4 = (long)(int)iterator._M_node;
        ppVar5 = std::_Rb_tree_iterator<std::pair<spvtools::opt::SENode_*const,_long>_>::operator->
                           (&local_30);
        ppVar5->second = lVar4 + ppVar5->second;
      }
    }
    else {
      iVar2 = (**_sign->_vptr_SENode)();
      if (iVar2 == 3) {
        bVar1 = AccumulatorsFromMultiply(this,_sign,(bool)(iterator._M_node._7_1_ & 1));
        if (!bVar1) {
          (*child_local->_vptr_SENode[3])(child_local,_sign);
        }
      }
      else {
        iVar2 = (**_sign->_vptr_SENode)();
        pSVar7 = _sign;
        if (iVar2 == 2) {
          __end6 = SENode::begin(_sign);
          next_child = (SENode *)SENode::end(pSVar7);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                             *)&next_child), bVar1) {
            ppSVar6 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                      ::operator*(&__end6);
            GatherAccumulatorsFromChildNodes
                      (this,child_local,*ppSVar6,(bool)(iterator._M_node._7_1_ & 1));
            __gnu_cxx::
            __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
            ::operator++(&__end6);
          }
        }
        else {
          iVar2 = (**_sign->_vptr_SENode)();
          if (iVar2 == 4) {
            pSVar7 = SENode::GetChild(_sign,0);
            GatherAccumulatorsFromChildNodes
                      (this,child_local,pSVar7,(bool)((iterator._M_node._7_1_ ^ 0xff) & 1));
          }
          else {
            (*child_local->_vptr_SENode[3])(child_local,_sign);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SENodeSimplifyImpl::GatherAccumulatorsFromChildNodes(SENode* new_node,
                                                          SENode* child,
                                                          bool negation) {
  int32_t sign = negation ? -1 : 1;

  if (child->GetType() == SENode::Constant) {
    // Collect all the constants and add them together.
    constant_accumulator_ +=
        child->AsSEConstantNode()->FoldToSingleValue() * sign;

  } else if (child->GetType() == SENode::ValueUnknown ||
             child->GetType() == SENode::RecurrentAddExpr) {
    // To rebuild the graph of X+X+X*2 into 4*X we count the occurrences of X
    // and create a new node of count*X after. X can either be a ValueUnknown or
    // a RecurrentAddExpr. The count for each X is stored in the accumulators_
    // map.

    auto iterator = accumulators_.find(child);
    // If we've encountered this term before add to the accumulator for it.
    if (iterator == accumulators_.end())
      accumulators_.insert({child, sign});
    else
      iterator->second += sign;

  } else if (child->GetType() == SENode::Multiply) {
    if (!AccumulatorsFromMultiply(child, negation)) {
      new_node->AddChild(child);
    }

  } else if (child->GetType() == SENode::Add) {
    for (SENode* next_child : *child) {
      GatherAccumulatorsFromChildNodes(new_node, next_child, negation);
    }

  } else if (child->GetType() == SENode::Negative) {
    SENode* negated_node = child->GetChild(0);
    GatherAccumulatorsFromChildNodes(new_node, negated_node, !negation);
  } else {
    // If we can't work out how to fold the expression just add it back into
    // the graph.
    new_node->AddChild(child);
  }
}